

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbezier.cpp
# Opt level: O0

VPointF __thiscall VBezier::derivative(VBezier *this,float t)

{
  float *in_RDI;
  float in_XMM0_Da;
  VPointF VVar1;
  float c;
  float b;
  float a;
  float d;
  float m_t;
  float in_stack_ffffffffffffffbc;
  VPointF local_30;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  
  local_18 = 1.0 - in_XMM0_Da;
  local_1c = in_XMM0_Da * in_XMM0_Da;
  local_20 = -local_18 * local_18;
  local_24 = local_1c * 3.0 + in_XMM0_Da * -4.0 + 1.0;
  local_28 = (in_XMM0_Da + in_XMM0_Da) - local_1c * 3.0;
  VPointF::VPointF(&local_30,
                   local_1c * in_RDI[6] +
                   local_28 * in_RDI[4] + local_20 * *in_RDI + local_24 * in_RDI[2],
                   local_1c * in_RDI[7] +
                   local_28 * in_RDI[5] + local_20 * in_RDI[1] + local_24 * in_RDI[3]);
  VVar1 = ::operator*(in_stack_ffffffffffffffbc,(VPointF *)0x131335);
  return VVar1;
}

Assistant:

VPointF VBezier::derivative(float t) const
{
    // p'(t) = 3 * (-(1-2t+t^2) * p0 + (1 - 4 * t + 3 * t^2) * p1 + (2 * t - 3 *
    // t^2) * p2 + t^2 * p3)

    float m_t = 1.0f - t;

    float d = t * t;
    float a = -m_t * m_t;
    float b = 1 - 4 * t + 3 * d;
    float c = 2 * t - 3 * d;

    return 3 * VPointF(a * x1 + b * x2 + c * x3 + d * x4,
                       a * y1 + b * y2 + c * y3 + d * y4);
}